

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O0

void wallet::StartWallets(WalletContext *context)

{
  bool bVar1;
  byte bVar2;
  milliseconds in_RDI;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> *pwallet;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  CWallet *in_stack_fffffffffffffee0;
  duration<long,_std::ratio<1L,_1000L>_> *this;
  function<void_()> *in_stack_fffffffffffffee8;
  Function *in_stack_fffffffffffffef0;
  milliseconds in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  allocator<char> *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  milliseconds in_stack_ffffffffffffff58;
  allocator<char> local_51;
  shared_ptr<wallet::CWallet> *local_50;
  shared_ptr<wallet::CWallet> *local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GetWallets((WalletContext *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  local_48 = (shared_ptr<wallet::CWallet> *)
             _GLOBAL__N_1::std::
             vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
             ::begin((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                      *)in_stack_fffffffffffffee0);
  local_50 = (shared_ptr<wallet::CWallet> *)
             _GLOBAL__N_1::std::
             vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
             ::end((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                    *)in_stack_fffffffffffffee0);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                           ((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                             *)in_stack_fffffffffffffee8,
                            (__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                             *)in_stack_fffffffffffffee0), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                 *)in_stack_fffffffffffffed8);
    _GLOBAL__N_1::std::
    __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffed8);
    CWallet::postInitProcess(in_stack_fffffffffffffee0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                  *)in_stack_fffffffffffffed8);
  }
  _GLOBAL__N_1::std::
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
  ~vector((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           *)in_stack_fffffffffffffee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  bVar2 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
  std::__cxx11::string::~string(in_stack_fffffffffffffed8);
  std::allocator<char>::~allocator(&local_51);
  if ((bVar2 & 1) != 0) {
    in_stack_fffffffffffffef0 = *(Function **)(in_RDI.__r + 8);
    std::function<void()>::function<wallet::StartWallets(wallet::WalletContext&)::__0,void>
              (in_stack_fffffffffffffee8,(anon_class_8_1_bc11688f *)in_stack_fffffffffffffee0);
    in_stack_fffffffffffffef8 = ms<(char)53,(char)48,(char)48>();
    CScheduler::scheduleEvery
              ((CScheduler *)in_stack_fffffffffffffef8.__r,in_stack_fffffffffffffef0,
               in_stack_ffffffffffffff58);
    std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffffed8);
  }
  this = *(duration<long,_std::ratio<1L,_1000L>_> **)(in_RDI.__r + 8);
  std::function<void()>::function<wallet::StartWallets(wallet::WalletContext&)::__1,void>
            (in_stack_fffffffffffffee8,(anon_class_8_1_bc11688f *)this);
  min<(char)49>();
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<60l,1l>,void>
            (this,(duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffed8);
  CScheduler::scheduleEvery
            ((CScheduler *)in_stack_fffffffffffffef8.__r,in_stack_fffffffffffffef0,in_RDI);
  std::function<void_()>::~function((function<void_()> *)in_stack_fffffffffffffed8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void StartWallets(WalletContext& context)
{
    for (const std::shared_ptr<CWallet>& pwallet : GetWallets(context)) {
        pwallet->postInitProcess();
    }

    // Schedule periodic wallet flushes and tx rebroadcasts
    if (context.args->GetBoolArg("-flushwallet", DEFAULT_FLUSHWALLET)) {
        context.scheduler->scheduleEvery([&context] { MaybeCompactWalletDB(context); }, 500ms);
    }
    context.scheduler->scheduleEvery([&context] { MaybeResendWalletTxs(context); }, 1min);
}